

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-offline-flexibility-estimator.cpp
# Opt level: O3

int testDerivator(void)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  code *pcVar5;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar6;
  ostream *poVar7;
  long *plVar8;
  undefined8 *puVar9;
  Index index;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *pdVar17;
  ActualDstType actualDst;
  Matrix<double,__1,__1,_0,__1,__1> **ppMVar18;
  double dVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  byte bVar24;
  Vector uk;
  GaussianWhiteNoise MeasurementNoise;
  IndexedMatrixArray state;
  GaussianWhiteNoise processNoise;
  Vector x0;
  Matrix r;
  Matrix q;
  Matrix r1;
  Matrix q1;
  IndexedMatrixArray u;
  IndexedMatrixArray dta;
  ofstream f;
  Matrix<double,__1,__1,_0,__1,__1> *local_598;
  long lStack_590;
  assign_op<double,_double> local_581;
  double local_580;
  uint local_578 [2];
  Matrix<double,__1,__1,_0,__1,__1> *local_570;
  long lStack_568;
  Matrix<double,__1,__1,_0,__1,__1> *local_560;
  undefined1 *puStack_558;
  long local_550;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_548;
  long local_540;
  long lStack_538;
  undefined8 local_530;
  long lStack_528;
  double local_520;
  code *local_518;
  ulong uStack_510;
  void *local_508;
  void *local_4f0;
  undefined1 local_4e0 [8];
  RhsNested local_4d8;
  long lStack_4d0;
  Matrix<double,__1,__1,_0,__1,__1> *local_4c8;
  undefined1 *puStack_4c0;
  long local_4b8;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_4b0;
  long local_4a8;
  long lStack_4a0;
  undefined8 local_498;
  long lStack_490;
  Matrix<double,__1,__1,_0,__1,__1> local_488;
  void *local_460;
  double local_450;
  void *local_448 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_438;
  Matrix<double,__1,__1,_0,__1,__1> local_418;
  Matrix<double,__1,__1,_0,__1,__1> local_400;
  Matrix<double,__1,__1,_0,__1,__1> local_3e8;
  uint local_3d0 [2];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_3c8 [16];
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_380;
  undefined1 local_378 [8];
  Index local_370;
  Index local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_328;
  code *local_288;
  undefined8 local_280;
  undefined8 local_278;
  code **local_270;
  undefined8 local_268;
  ulong local_258;
  ios_base local_190 [264];
  undefined4 local_88 [2];
  Matrix<double,__1,__1,_0,__1,__1> *local_80 [2];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  bVar24 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_578);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_88);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_3d0);
  local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem((IMUDynamicalSystem *)&local_288);
  local_370 = 0x12;
  local_368 = 0x12;
  local_358 = 0x12;
  local_350 = 0x12;
  local_348 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_3e8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_378);
  uVar4 = stateObservation::IMUDynamicalSystem::getStateSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise((GaussianWhiteNoise *)&local_488,uVar4);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&local_488);
  stateObservation::IMUDynamicalSystem::setProcessNoise((NoiseBase *)&local_288);
  local_4e0 = (undefined1  [8])&local_3e8;
  local_4d8.m_matrix = &local_3e8;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_378,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_4e0);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            (&local_418,(Matrix<double,__1,__1,_0,__1,__1> *)local_378,
             (assign_op<double,_double> *)&local_518);
  free((void *)CONCAT44(local_378._4_4_,local_378._0_4_));
  local_370 = 6;
  local_368 = 6;
  local_358 = 6;
  local_350 = 6;
  local_348 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_400,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)local_378);
  uVar4 = stateObservation::IMUDynamicalSystem::getMeasurementSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise((GaussianWhiteNoise *)&local_518,uVar4);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&local_518);
  stateObservation::IMUDynamicalSystem::setMeasurementNoise((NoiseBase *)&local_288);
  local_4e0 = (undefined1  [8])&local_400;
  local_4d8.m_matrix = &local_400;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_378,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_4e0);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
            (&local_438,(Matrix<double,__1,__1,_0,__1,__1> *)local_378,
             (assign_op<double,_double> *)&local_598);
  free((void *)CONCAT44(local_378._4_4_,local_378._0_4_));
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)local_378);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
            ((DynamicalSystemFunctorBase *)local_378);
  local_4e0 = (undefined1  [8])0x12;
  lStack_4d0 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_448,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_4e0);
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)local_378,(uint)local_448);
  dVar19 = 0.0;
  lVar23 = 0;
  do {
    uVar4 = stateObservation::IMUDynamicalSystem::getInputSize();
    local_4e0 = (undefined1  [8])(ulong)uVar4;
    lStack_4d0 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_598,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_4e0);
    local_580 = (double)(int)lVar23;
    dVar16 = sin(local_580 * 0.3141592653589793);
    if (lStack_590 < 1) {
LAB_0010999b:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    (local_598->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
         (double *)(dVar16 * 0.4);
    local_520 = local_580 * 0.2617993877991494;
    dVar16 = sin(local_520);
    if (lStack_590 < 2) goto LAB_0010999b;
    (local_598->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows =
         (Index)(dVar16 * 0.6);
    local_450 = local_580 * 0.6283185307179586;
    dVar16 = sin(local_450);
    if (lStack_590 < 3) goto LAB_0010999b;
    (local_598->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols =
         (Index)(dVar16 * 0.2);
    dVar16 = sin(local_520);
    if (lStack_590 < 4) goto LAB_0010999b;
    local_598[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)(dVar16 * 10.0);
    dVar16 = sin(local_580 * 0.20943951023931953);
    if (lStack_590 < 5) goto LAB_0010999b;
    local_598[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)(dVar16 * 0.07);
    dVar16 = sin(local_450);
    if (lStack_590 < 6) goto LAB_0010999b;
    local_598[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)(dVar16 * 0.05);
    local_580 = (double)(lVar23 * 10);
    lVar22 = 10;
    local_520 = dVar19;
    do {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_4e0,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_598);
      lVar10 = (local_398 - local_390 >> 3) * -0x5555555555555555 +
               ((local_380 - local_3a0 >> 3) + -1 + (ulong)(local_380 == 0)) * 0x15;
      lVar13 = local_3a8 - local_3b8 >> 3;
      lVar15 = lVar13 * -0x5555555555555555 + lVar10;
      if (lVar15 == 0) {
LAB_00108b01:
        if (lVar10 == lVar13 * 0x5555555555555555) {
          local_3d0[0] = SUB84(dVar19,0);
        }
        std::
        deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(local_3c8,(value_type *)local_4e0);
      }
      else {
        dVar16 = (double)(lVar15 + (ulong)local_3d0[0]);
        if (((ulong)dVar19 < (ulong)local_3d0[0]) || ((ulong)dVar16 <= (ulong)dVar19)) {
          if (dVar19 == dVar16) goto LAB_00108b01;
          goto LAB_0010995d;
        }
        uVar21 = (ulong)(SUB84(dVar19,0) - local_3d0[0]);
        uVar11 = (local_3b8 - local_3b0 >> 3) * -0x5555555555555555 + uVar21;
        if ((long)uVar11 < 0) {
          uVar21 = ~(~uVar11 / 0x15);
LAB_00108b76:
          lVar10 = uVar21 * -0x1f8 + *(long *)(local_3a0 + uVar21 * 8);
          uVar21 = uVar11;
        }
        else {
          lVar10 = local_3b8;
          if (0x14 < uVar11) {
            uVar21 = uVar11 / 0x15;
            goto LAB_00108b76;
          }
        }
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar10 + uVar21 * 0x18),
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_4e0,&local_581);
      }
      free((void *)local_4e0);
      dVar19 = (double)((long)dVar19 + 1);
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
    stateObservation::DynamicalSystemSimulator::setInput((Matrix *)local_378,(uint)&local_598);
    free(local_598);
    lVar23 = lVar23 + 1;
    dVar19 = (double)((long)local_520 + 10);
  } while (lVar23 != 300);
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(0.001);
  stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((uint)local_378);
  stateObservation::DynamicalSystemSimulator::getMeasurementArray((uint)local_4e0,(uint)local_378);
  local_88[0] = local_4e0._0_4_;
  local_598 = local_80[0];
  lStack_590 = (long)local_80[1];
  pdVar17 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&local_4d8;
  ppMVar18 = local_80;
  for (lVar23 = 10; lVar23 != 0; lVar23 = lVar23 + -1) {
    *ppMVar18 = *(Matrix<double,__1,__1,_0,__1,__1> **)pdVar17;
    pdVar17 = pdVar17 + (ulong)bVar24 * -0x10 + 8;
    ppMVar18 = ppMVar18 + (ulong)bVar24 * -2 + 1;
  }
  local_4d8.m_matrix = local_80[0];
  lStack_4d0 = (long)local_80[1];
  local_4c8 = (Matrix<double,__1,__1,_0,__1,__1> *)local_70;
  puStack_4c0 = (undefined1 *)uStack_68;
  local_4b8 = local_60;
  pMStack_4b0 = (Matrix<double,__1,__1,_0,__1,__1> *)uStack_58;
  local_4a8 = local_50;
  lStack_4a0 = uStack_48;
  local_498 = local_40;
  lStack_490 = uStack_38;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)&local_4d8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_4d8);
  stateObservation::DynamicalSystemSimulator::getStateArray((uint)local_4e0,(uint)local_378);
  lStack_490 = lStack_528;
  lStack_4a0 = lStack_538;
  local_4a8 = local_540;
  pMStack_4b0 = pMStack_548;
  local_4b8 = local_550;
  puStack_4c0 = puStack_558;
  local_4c8 = local_560;
  local_578[0] = local_4e0._0_4_;
  local_598 = local_570;
  lStack_590 = lStack_568;
  pdVar17 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&local_4d8;
  ppMVar18 = &local_570;
  for (lVar23 = 10; lVar23 != 0; lVar23 = lVar23 + -1) {
    *ppMVar18 = *(Matrix<double,__1,__1,_0,__1,__1> **)pdVar17;
    pdVar17 = pdVar17 + (ulong)bVar24 * -0x10 + 8;
    ppMVar18 = ppMVar18 + (ulong)bVar24 * -2 + 1;
  }
  local_4d8.m_matrix = local_570;
  lStack_4d0 = lStack_568;
  local_498 = local_530;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)&local_4d8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_4d8);
  free(local_448[0]);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)local_378);
  local_518 = stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
              setProcessNoiseCovariance;
  free(local_4f0);
  free(local_508);
  free(local_400.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
       setProcessNoiseCovariance;
  free(local_460);
  free((void *)local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols);
  free(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem((IMUDynamicalSystem *)&local_288);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_378);
  uVar21 = (ulong)local_578[0];
  if ((local_540 - lStack_538 >> 3) * -0x5555555555555555 +
      ((lStack_528 - (long)pMStack_548 >> 3) + -1 + (ulong)(lStack_528 == 0)) * 0x15 ==
      (local_550 - (long)local_560 >> 3) * 0x5555555555555555) {
    uVar21 = 0;
  }
  while( true ) {
    lVar23 = (local_550 - (long)local_560 >> 3) * -0x5555555555555555 +
             (local_540 - lStack_538 >> 3) * -0x5555555555555555 +
             ((lStack_528 - (long)pMStack_548 >> 3) + -1 + (ulong)(lStack_528 == 0)) * 0x15;
    uVar4 = (local_578[0] - 1) + (int)lVar23;
    if (lVar23 == 0) {
      uVar4 = 0;
    }
    uVar20 = (uint)uVar21;
    if (uVar4 < uVar20) break;
    local_288 = (code *)0x6;
    local_278 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_488,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_288);
    lVar23 = (local_550 - (long)local_560 >> 3) * -0x5555555555555555 +
             (local_540 - lStack_538 >> 3) * -0x5555555555555555 +
             ((lStack_528 - (long)pMStack_548 >> 3) + -1 + (ulong)(lStack_528 == 0)) * 0x15;
    if (lVar23 == 0) goto LAB_0010997c;
    uVar11 = (ulong)(uVar20 - local_578[0]);
    if ((uVar20 < local_578[0]) || (lVar23 + (ulong)local_578[0] <= uVar21)) goto LAB_0010997c;
    uVar12 = ((long)local_560 - (long)puStack_558 >> 3) * -0x5555555555555555 + uVar11;
    if ((long)uVar12 < 0) {
      uVar11 = ~(~uVar12 / 0x15);
LAB_00108f80:
      pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
               ((&(pMStack_548->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_data)[uVar11] + uVar11 * 0xffffffffffffffc1);
      uVar11 = uVar12;
    }
    else {
      pMVar6 = local_560;
      if (0x14 < uVar12) {
        uVar11 = uVar12 / 0x15;
        goto LAB_00108f80;
      }
    }
    pMVar6 = pMVar6 + uVar11;
    local_518 = (code *)0x0;
    uStack_510 = 0;
    pdVar3 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    uVar11 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
    lVar23 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if (uVar11 == 0) {
      uVar12 = 0;
      if (lVar23 != 1) goto LAB_001099d9;
    }
    else {
      if (((long)uVar11 < 0) || (lVar23 != 1)) goto LAB_001099d9;
      if (0x1fffffffffffffff < uVar11) {
LAB_00109a17:
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = std::ios::widen;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pcVar5 = (code *)malloc(uVar11 * 8);
      if (uVar11 != 1 && ((ulong)pcVar5 & 0xf) != 0) goto LAB_00109a73;
      if (pcVar5 == (code *)0x0) goto LAB_00109a17;
      local_518 = pcVar5;
      uStack_510 = uVar11;
      if (uVar11 == 1) {
        uVar12 = 0;
      }
      else {
        uVar12 = uVar11 & 0x1ffffffffffffffe;
        uVar14 = 0;
        do {
          pdVar2 = pdVar3 + uVar14;
          dVar19 = pdVar2[1];
          *(double *)(pcVar5 + uVar14 * 8) = *pdVar2;
          *(double *)((long)(pcVar5 + uVar14 * 8) + 8) = dVar19;
          uVar14 = uVar14 + 2;
        } while (uVar14 < uVar12);
      }
    }
    if ((long)uVar12 < (long)uVar11) {
      do {
        *(double *)(local_518 + uVar12 * 8) = pdVar3[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    local_280 = 3;
    local_270 = &local_518;
    local_268 = 0;
    local_288 = local_518;
    local_258 = uVar11;
    if ((long)uVar11 < 3) goto LAB_001099ba;
    local_4e0 = (undefined1  [8])
                local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data;
    local_4d8.m_matrix = (Matrix<double,__1,__1,_0,__1,__1> *)0x3;
    local_4c8 = &local_488;
    puStack_4c0 = (undefined1 *)0x0;
    pMStack_4b0 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
    if (local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        < 3) goto LAB_001099ba;
    Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::operator=
              ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               local_4e0,
               (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               &local_288);
    free(local_518);
    lVar23 = (local_550 - (long)local_560 >> 3) * -0x5555555555555555 +
             (local_540 - lStack_538 >> 3) * -0x5555555555555555 +
             ((lStack_528 - (long)pMStack_548 >> 3) + -1 + (ulong)(lStack_528 == 0)) * 0x15;
    if (lVar23 == 0) goto LAB_0010997c;
    uVar11 = (ulong)(uVar20 - local_578[0]);
    if ((uVar20 < local_578[0]) || (lVar23 + (ulong)local_578[0] <= uVar21)) goto LAB_0010997c;
    uVar12 = ((long)local_560 - (long)puStack_558 >> 3) * -0x5555555555555555 + uVar11;
    if ((long)uVar12 < 0) {
      uVar11 = ~(~uVar12 / 0x15);
LAB_00109201:
      pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
               ((&(pMStack_548->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_data)[uVar11] + uVar11 * 0xffffffffffffffc1);
      uVar11 = uVar12;
    }
    else {
      pMVar6 = local_560;
      if (0x14 < uVar12) {
        uVar11 = uVar12 / 0x15;
        goto LAB_00109201;
      }
    }
    pMVar6 = pMVar6 + uVar11;
    local_518 = (code *)0x0;
    uStack_510 = 0;
    pdVar3 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    uVar11 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
    lVar23 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if (uVar11 == 0) {
      uVar12 = 0;
      if (lVar23 != 1) goto LAB_001099d9;
    }
    else {
      if (((long)uVar11 < 0) || (lVar23 != 1)) {
LAB_001099d9:
        uStack_510 = 0;
        local_518 = (code *)0x0;
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (0x1fffffffffffffff < uVar11) {
LAB_00109a45:
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = std::ios::widen;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pcVar5 = (code *)malloc(uVar11 * 8);
      if (uVar11 != 1 && ((ulong)pcVar5 & 0xf) != 0) {
LAB_00109a73:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pcVar5 == (code *)0x0) goto LAB_00109a45;
      local_518 = pcVar5;
      uStack_510 = uVar11;
      if (uVar11 == 1) {
        uVar12 = 0;
      }
      else {
        uVar12 = uVar11 & 0x1ffffffffffffffe;
        uVar14 = 0;
        do {
          pdVar2 = pdVar3 + uVar14;
          dVar19 = pdVar2[1];
          *(double *)(pcVar5 + uVar14 * 8) = *pdVar2;
          *(double *)((long)(pcVar5 + uVar14 * 8) + 8) = dVar19;
          uVar14 = uVar14 + 2;
        } while (uVar14 < uVar12);
      }
    }
    if ((long)uVar12 < (long)uVar11) {
      do {
        *(double *)(local_518 + uVar12 * 8) = pdVar3[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    local_288 = local_518 + 0x18;
    local_280 = 3;
    local_270 = &local_518;
    local_268 = 3;
    local_258 = uVar11;
    if ((long)uVar11 < 6) {
LAB_001099ba:
      local_270 = &local_518;
      local_280 = 3;
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    puStack_4c0 = (undefined1 *)
                  ((long)&(((Matrix<double,__1,__1,_0,__1,__1> *)
                           (local_488.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows + -0x18))->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_cols + 5);
    local_4e0 = (undefined1  [8])
                (&(((Matrix<double,__1,__1,_0,__1,__1> *)
                   (local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + -3))->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
                + local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows);
    local_4d8.m_matrix = (Matrix<double,__1,__1,_0,__1,__1> *)0x3;
    local_4c8 = &local_488;
    pMStack_4b0 = (Matrix<double,__1,__1,_0,__1,__1> *)
                  local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
    if (local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        < 3) goto LAB_001099ba;
    Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::operator=
              ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               local_4e0,
               (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
               &local_288);
    free(local_518);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_288,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_488);
    lVar23 = (local_340 - local_338 >> 3) * -0x5555555555555555 +
             ((local_328 - local_348 >> 3) + -1 + (ulong)(local_328 == 0)) * 0x15;
    lVar22 = local_350 - local_360 >> 3;
    lVar10 = lVar22 * -0x5555555555555555 + lVar23;
    if (lVar10 == 0) {
LAB_00109470:
      if (lVar23 == lVar22 * 0x5555555555555555) {
        local_378._0_4_ = uVar20;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)&local_370,(value_type *)&local_288);
    }
    else {
      uVar12 = lVar10 + (ulong)(uint)local_378._0_4_;
      uVar11 = (ulong)(uVar20 - local_378._0_4_);
      if ((uVar20 < (uint)local_378._0_4_) || (uVar12 <= uVar21)) {
        if (uVar12 != uVar21) {
LAB_0010995d:
          __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0xaa,
                        "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const")
          ;
        }
        goto LAB_00109470;
      }
      uVar21 = (local_360 - local_358 >> 3) * -0x5555555555555555 + uVar11;
      if ((long)uVar21 < 0) {
        uVar11 = ~(~uVar21 / 0x15);
LAB_001094e5:
        lVar23 = uVar11 * -0x1f8 + *(long *)(local_348 + uVar11 * 8);
        uVar11 = uVar21;
      }
      else {
        lVar23 = local_360;
        if (0x14 < uVar21) {
          uVar11 = uVar21 / 0x15;
          goto LAB_001094e5;
        }
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar23 + uVar11 * 0x18),
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_288,
                 (assign_op<double,_double> *)local_4e0);
    }
    free(local_288);
    free(local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    uVar21 = (ulong)(uVar20 + 1);
  }
  stateObservation::kine::reconstructStateTrajectory
            ((kine *)local_4e0,(IndexedMatrixArray *)local_378,0.001);
  std::ofstream::ofstream(&local_288);
  std::ofstream::open((char *)&local_288,0x114350);
  uVar21 = (ulong)local_578[0];
  if ((local_540 - lStack_538 >> 3) * -0x5555555555555555 +
      ((lStack_528 - (long)pMStack_548 >> 3) + -1 + (ulong)(lStack_528 == 0)) * 0x15 ==
      (local_550 - (long)local_560 >> 3) * 0x5555555555555555) {
    uVar21 = 0;
  }
  while( true ) {
    lVar23 = (local_550 - (long)local_560 >> 3) * -0x5555555555555555 +
             (local_540 - lStack_538 >> 3) * -0x5555555555555555 +
             ((lStack_528 - (long)pMStack_548 >> 3) + -1 + (ulong)(lStack_528 == 0)) * 0x15;
    uVar4 = (local_578[0] - 1) + (int)lVar23;
    if (lVar23 == 0) {
      uVar4 = 0;
    }
    uVar20 = (uint)uVar21;
    if (uVar4 < uVar20) {
      local_288 = _VTT;
      *(undefined8 *)((long)&local_288 + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&local_280);
      std::ios_base::~ios_base(local_190);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_4d8);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_370);
      free(local_438.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_418.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque(local_3c8);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_80);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_570);
      return 0;
    }
    if (((lVar23 == 0) || (uVar20 < local_578[0])) || (lVar23 + (ulong)local_578[0] <= uVar21))
    break;
    uVar11 = (ulong)(uVar20 - local_578[0]);
    uVar12 = ((long)local_560 - (long)puStack_558 >> 3) * -0x5555555555555555 + uVar11;
    if ((long)uVar12 < 0) {
      uVar11 = ~(~uVar12 / 0x15);
LAB_001096e8:
      pMVar6 = (Matrix<double,__1,__1,_0,__1,__1> *)
               ((&(pMStack_548->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_data)[uVar11] + uVar11 * 0xffffffffffffffc1);
      uVar11 = uVar12;
    }
    else {
      pMVar6 = local_560;
      if (0x14 < uVar12) {
        uVar11 = uVar12 / 0x15;
        goto LAB_001096e8;
      }
    }
    ppdVar1 = (double **)(pMVar6 + uVar11);
    lVar23 = (local_4b8 - (long)local_4c8 >> 3) * -0x5555555555555555 +
             (local_4a8 - lStack_4a0 >> 3) * -0x5555555555555555 +
             ((lStack_490 - (long)pMStack_4b0 >> 3) + -1 + (ulong)(lStack_490 == 0)) * 0x15;
    if (lVar23 == 0) break;
    if ((uVar20 < (uint)local_4e0._0_4_) || (lVar23 + ((ulong)local_4e0 & 0xffffffff) <= uVar21))
    break;
    uVar21 = (ulong)(uVar20 - local_4e0._0_4_);
    uVar11 = ((long)local_4c8 - (long)puStack_4c0 >> 3) * -0x5555555555555555 + uVar21;
    if ((long)uVar11 < 0) {
      uVar21 = ~(~uVar11 / 0x15);
LAB_001097f1:
      local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)((&(pMStack_4b0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                     .m_storage.m_data)[uVar21] + uVar21 * 0xffffffffffffffc1);
      uVar21 = uVar11;
    }
    else {
      local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)local_4c8;
      if (0x14 < uVar11) {
        uVar21 = uVar11 / 0x15;
        goto LAB_001097f1;
      }
    }
    local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         + uVar21 * 0x18;
    local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)ppdVar1;
    if ((ppdVar1[1] !=
         (double *)
         (((Matrix<double,__1,__1,_0,__1,__1> *)
          local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_rows) ||
       (ppdVar1[2] !=
        (double *)
        (((Matrix<double,__1,__1,_0,__1,__1> *)
         local_488.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         )->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    poVar7 = Eigen::operator<<((ostream *)&local_288,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                *)&local_488);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    plVar8 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    uVar21 = (ulong)(uVar20 + 1);
  }
LAB_0010997c:
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
}

Assistant:

int testDerivator()
{
    /// The number of samples
    const unsigned kmax=3000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    //const unsigned inputSize=6;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray x;
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    ///The covariance matrix of the process noise and the measurement noise
    Matrix q;
    Matrix r;

    {
        ///simulation of the signal
        /// the IMU dynamical system functor
        IMUDynamicalSystem imu;

        ///The process noise initialization
        Matrix q1=Matrix::Identity(stateSize,stateSize)*0.00;
        GaussianWhiteNoise processNoise(imu.getStateSize());
        processNoise.setStandardDeviation(q1);
        imu.setProcessNoise( & processNoise );
        q=q1*q1.transpose();

        ///The measurement noise initialization
        Matrix r1=Matrix::Identity(measurementSize,measurementSize)*0.0;
        GaussianWhiteNoise MeasurementNoise(imu.getMeasurementSize());
        MeasurementNoise.setStandardDeviation(r1);
        imu.setMeasurementNoise( & MeasurementNoise );
        r=r1*r1.transpose();

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor(&imu);

        ///initialization of the state vector
        Vector x0=Vector::Zero(stateSize,1);
        sim.setState(x0,0);

        ///construction of the input
        /// the input is constant over 10 time samples
        for (unsigned i=0;i<kmax/10;++i)
        {
            Vector uk=Vector::Zero(imu.getInputSize(),1);

            uk[0]=0.4 * sin(M_PI/10*i);
            uk[1]=0.6 * sin(M_PI/12*i);
            uk[2]=0.2 * sin(M_PI/5*i);

            uk[3]=10  * sin(M_PI/12*i);
            uk[4]=0.07  * sin(M_PI/15*i);
            uk[5]=0.05 * sin(M_PI/5*i);

            ///filling the 10 time samples of the constant input
            for (int j=0;j<10;++j)
            {
                u.setValue(uk,i*10+j);
            }

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,10*i);

        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        ///launched the simulation to the time kmax+1
        sim.simulateDynamicsTo(kmax+1);

        ///extract the array of measurements and states
        y = sim.getMeasurementArray(1,kmax);
        x = sim.getStateArray(1,kmax);
    }

    IndexedMatrixArray dta;

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        Vector xi = Vector::Zero(6,1);

        xi.head(3) = Vector(x[i]).segment(kine::pos,3);
        xi.tail(3) = Vector(x[i]).segment(kine::ori,3);

        dta.setValue(xi,i);
    }

    IndexedMatrixArray state = kine::reconstructStateTrajectory(dta,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    for (unsigned i=x.getFirstIndex() ; i<=x.getLastIndex() ; ++i)
    {
        //f<<dta[i].transpose()<<"\t#####\t\t"<<Vector(Vector(x[i]).segment(9,3)).transpose()<<"\t#####\t\t"<<(x[i]-state[i]).transpose()<<std::endl;
        f<<(x[i]-state[i])<<std::endl<<std::endl;
    }

    return 0;


}